

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

void chaiscript::Boxed_Number::check_divide_by_zero<unsigned_int>(uint t,type *param_2)

{
  undefined8 uVar1;
  arithmetic_error *in_RSI;
  int in_EDI;
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  if (in_EDI == 0) {
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"divide by zero",&local_31);
    exception::arithmetic_error::arithmetic_error(in_RSI,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&exception::arithmetic_error::typeinfo,
                exception::arithmetic_error::~arithmetic_error);
  }
  return;
}

Assistant:

static inline void check_divide_by_zero(T t, typename std::enable_if<std::is_integral<T>::value>::type* = nullptr)
      {
#ifndef CHAISCRIPT_NO_PROTECT_DIVIDEBYZERO
        if (t == 0) {
          throw chaiscript::exception::arithmetic_error("divide by zero");
        }
#endif
      }